

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateArrayIndex(ExpressionEvalContext *ctx,ExprArrayIndex *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  TypeBase *pTVar3;
  _func_int **pp_Var4;
  int iVar5;
  ExprIntegerLiteral *expr;
  undefined4 extraout_var;
  ExprMemoryLiteral *memory;
  ExprBase *pEVar6;
  TypeRef *pTVar7;
  ExprBase *pEVar8;
  ExprPointerLiteral *this;
  undefined4 extraout_var_01;
  _func_int **pp_Var9;
  char *msg;
  SynBase *pSVar10;
  uchar *end;
  _func_int ***ptr;
  undefined4 extraout_var_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar10 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar10;
    pEVar6->type = pTVar3;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
    return pEVar6;
  }
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
    if (memory == (ExprMemoryLiteral *)0x0) {
      return (ExprBase *)0x0;
    }
    pEVar6 = Evaluate(ctx,expression->index);
    if (pEVar6 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    switch(pEVar6->typeID) {
    case 3:
      pp_Var9 = (_func_int **)(ulong)(byte)pEVar6->field_0x29;
      break;
    case 4:
      pp_Var9 = (_func_int **)(long)(char)pEVar6->field_0x29;
      break;
    default:
      msg = "ERROR: failed to evaluate array index";
      goto LAB_0024ea75;
    case 6:
      pp_Var9 = pEVar6[1]._vptr_ExprBase;
      break;
    case 7:
      pp_Var9 = (_func_int **)(long)(double)pEVar6[1]._vptr_ExprBase;
    }
    pTVar3 = (memory->super_ExprBase).type;
    if (pTVar3 == (TypeBase *)0x0) {
LAB_0024ecae:
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x66d,"ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                   );
    }
    if (pTVar3->typeID == 0x12) {
      pp_Var4 = pTVar3[1]._vptr_TypeBase;
      if ((pp_Var4 == (_func_int **)0x0) || (*(int *)(pp_Var4 + 1) != 0x13)) {
        __assert_fail("arrayType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x671,
                      "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
      }
      uVar1 = (memory->super_ExprBase).typeID;
      if (uVar1 == 9) {
LAB_0024ebe5:
        msg = "ERROR: array index of a null array";
        goto LAB_0024ea75;
      }
      if ((-1 < (long)pp_Var9) && ((long)pp_Var9 < (long)pp_Var4[0xd])) {
        if (uVar1 != 0xc) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x67b,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        ptr = (_func_int ***)
              ((long)&(memory->ptr->super_ExprBase)._vptr_ExprBase +
              (long)pp_Var9 * *(long *)(pp_Var4[0xc] + 0x30));
        if (memory[1].super_ExprBase._vptr_ExprBase <
            (_func_int **)((long)ptr + *(long *)(pp_Var4[0xc] + 0x30))) {
          __assert_fail("ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x67c,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_01,iVar5);
        pSVar10 = (expression->super_ExprBase).source;
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var4[0xc]);
        end = (uchar *)((long)ptr + *(long *)(pp_Var4[0xc] + 0x30));
LAB_0024ec77:
        ExprPointerLiteral::ExprPointerLiteral
                  (this,pSVar10,&pTVar7->super_TypeBase,(uchar *)ptr,end);
        pEVar6 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
        return pEVar6;
      }
    }
    else {
      if (pTVar3->typeID != 0x14) goto LAB_0024ecae;
      if ((memory->super_ExprBase).typeID != 0xd) {
        __assert_fail("memory",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x64e,
                      "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
      }
      pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,*(TypeBase **)&pTVar3[1].typeIndex);
      pEVar6 = CreateExtract(ctx,memory,0,&pTVar7->super_TypeBase);
      if (pEVar6 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if (pEVar6->typeID == 9) goto LAB_0024ebe5;
      pEVar8 = CreateExtract(ctx,memory,8,ctx->ctx->typeInt);
      if ((pEVar8 == (ExprBase *)0x0) || (pEVar8->typeID != 6)) {
        return (ExprBase *)0x0;
      }
      if ((-1 < (long)pp_Var9) && ((long)pp_Var9 < (long)pEVar8[1]._vptr_ExprBase)) {
        if (pEVar6->typeID != 0xc) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x662,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        ptr = (_func_int ***)
              ((long)pp_Var9 * *(long *)(*(long *)&pTVar3[1].typeIndex + 0x30) +
              (long)pEVar6[1]._vptr_ExprBase);
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5);
        pSVar10 = (expression->super_ExprBase).source;
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,*(TypeBase **)&pTVar3[1].typeIndex);
        end = (uchar *)((long)ptr + *(long *)(*(long *)&pTVar3[1].typeIndex + 0x30));
        goto LAB_0024ec77;
      }
    }
    ReportCritical(ctx,"ERROR: array index out of bounds");
  }
  else {
    msg = "ERROR: instruction limit reached";
LAB_0024ea75:
    Report(ctx,msg);
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArrayIndex(ExpressionEvalContext &ctx, ExprArrayIndex *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	ExprBase *index = Evaluate(ctx, expression->index);

	if(!index)
		return NULL;

	long long result;
	if(!TryTakeLong(index, result))
		return Report(ctx, "ERROR: failed to evaluate array index");

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(value->type))
	{
		ExprMemoryLiteral *memory = getType<ExprMemoryLiteral>(value);

		assert(memory);

		ExprBase *value = CreateExtract(ctx, memory, 0, ctx.ctx.GetReferenceType(arrayType->subType));

		if(!value)
			return NULL;

		if(isType<ExprNullptrLiteral>(value))
			return Report(ctx, "ERROR: array index of a null array");

		ExprIntegerLiteral *size = getType<ExprIntegerLiteral>(CreateExtract(ctx, memory, sizeof(void*), ctx.ctx.typeInt));

		if(!size)
			return NULL;

		if(result < 0 || result >= size->value)
			return ReportCritical(ctx, "ERROR: array index out of bounds");

		ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

		assert(ptr);

		unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		return CheckType(expression, shifted);
	}

	TypeRef *refType = getType<TypeRef>(value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: array index of a null array");

	if(result < 0 || result >= arrayType->length)
		return ReportCritical(ctx, "ERROR: array index out of bounds");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

	return CheckType(expression, shifted);
}